

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_textedit_move_to_word_next(nk_text_edit *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_18;
  int c;
  int len;
  nk_text_edit *state_local;
  
  iVar1 = (state->string).len;
  local_18 = state->cursor;
  do {
    local_18 = local_18 + 1;
    bVar3 = false;
    if (local_18 < iVar1) {
      iVar2 = nk_is_word_boundary(state,local_18);
      bVar3 = iVar2 == 0;
    }
  } while (bVar3);
  if (iVar1 < local_18) {
    local_18 = iVar1;
  }
  return local_18;
}

Assistant:

NK_INTERN int
nk_textedit_move_to_word_next(struct nk_text_edit *state)
{
   const int len = state->string.len;
   int c = state->cursor+1;
   while( c < len && !nk_is_word_boundary(state, c))
      ++c;

   if( c > len )
      c = len;

   return c;
}